

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignumlib.cpp
# Opt level: O1

void CVmObjBigNum::alloc_temp_regs(size_t prec,size_t cnt,...)

{
  uint uVar1;
  undefined8 *puVar2;
  CVmBigNumCacheReg *pCVar3;
  bool bVar4;
  CVmBigNumCache *pCVar5;
  char in_AL;
  char *pcVar6;
  void **ppvVar7;
  uint uVar8;
  undefined8 in_RCX;
  ulong uVar9;
  void **ppvVar10;
  undefined8 in_RDX;
  size_t sVar11;
  undefined8 in_R8;
  undefined8 in_R9;
  uint16_t tmp;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list marker;
  void **local_100;
  void *local_e8 [4];
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  local_100 = &marker[0].overflow_arg_area;
  uVar8 = 0x10;
  if (cnt != 0) {
    bVar4 = false;
    sVar11 = cnt;
    local_e8[2] = (void *)in_RDX;
    local_e8[3] = (void *)in_RCX;
    local_c8 = in_R8;
    local_c0 = in_R9;
    do {
      uVar9 = (ulong)uVar8;
      if (uVar9 < 0x29) {
        uVar8 = uVar8 + 8;
        ppvVar7 = (void **)((long)local_e8 + uVar9);
      }
      else {
        ppvVar7 = local_100;
        local_100 = local_100 + 1;
      }
      puVar2 = (undefined8 *)*ppvVar7;
      uVar9 = (ulong)uVar8;
      if (uVar9 < 0x29) {
        uVar8 = uVar8 + 8;
        ppvVar7 = (void **)((long)local_e8 + uVar9);
      }
      else {
        ppvVar7 = local_100;
        local_100 = local_100 + 1;
      }
      pcVar6 = CVmBigNumCache::alloc_reg(S_bignum_cache,(prec + 1 >> 1) + 5,(uint *)*ppvVar7);
      if (pcVar6 == (char *)0x0) {
        bVar4 = true;
      }
      else {
        *(short *)pcVar6 = (short)prec;
        pcVar6[4] = '\0';
      }
      *puVar2 = pcVar6;
      sVar11 = sVar11 - 1;
    } while (sVar11 != 0);
    if (bVar4) {
      local_100 = &marker[0].overflow_arg_area;
      uVar8 = 0x10;
      do {
        pCVar5 = S_bignum_cache;
        uVar9 = (ulong)uVar8;
        if (uVar9 < 0x29) {
          uVar8 = uVar8 + 8;
          ppvVar7 = (void **)((long)local_e8 + uVar9);
        }
        else {
          ppvVar7 = local_100;
          local_100 = local_100 + 1;
        }
        uVar9 = (ulong)uVar8;
        if (uVar9 < 0x29) {
          uVar8 = uVar8 + 8;
          ppvVar10 = (void **)((long)local_e8 + uVar9);
        }
        else {
          ppvVar10 = local_100;
          local_100 = local_100 + 1;
        }
        if (**ppvVar7 != 0) {
          uVar1 = **ppvVar10;
          pCVar3 = S_bignum_cache->reg_;
          pCVar3[uVar1].nxt_ = S_bignum_cache->free_reg_;
          pCVar5->free_reg_ = pCVar3 + uVar1;
        }
        cnt = cnt - 1;
      } while (cnt != 0);
      err_throw(0xa28);
    }
  }
  return;
}

Assistant:

void CVmObjBigNum::alloc_temp_regs(size_t prec, size_t cnt, ...)
{
    va_list marker;
    size_t i;
    int failed;
    char **ext_ptr;
    uint *hdl_ptr;

    /* set up to read varargs */
    va_start(marker, cnt);

    /* no failures yet */
    failed = FALSE;

    /* scan the varargs list */
    for (i = 0 ; i < cnt ; ++i)
    {
        /* get the next argument */
        ext_ptr = va_arg(marker, char **);
        hdl_ptr = va_arg(marker, uint *);

        /* allocate a register */
        *ext_ptr = alloc_temp_reg(prec, hdl_ptr);

        /* if this allocation failed, note it, but keep going for now */
        if (*ext_ptr == 0)
            failed = TRUE;
    }

    /* done reading argument */
    va_end(marker);

    /* if we had any failures, free all of the registers we allocated */
    if (failed)
    {
        /* restart reading the varargs */
        va_start(marker, cnt);

        /* scan the varargs and free the successfully allocated registers */
        for (i = 0 ; i < cnt ; ++i)
        {
            /* get the next argument */
            ext_ptr = va_arg(marker, char **);
            hdl_ptr = va_arg(marker, uint *);

            /* free this register if we successfully allocated it */
            if (*ext_ptr != 0)
                release_temp_reg(*hdl_ptr);
        }

        /* done reading varargs */
        va_end(marker);

        /* throw the error */
        err_throw(VMERR_BIGNUM_NO_REGS);
    }
}